

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastZ64R1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  ulong uVar6;
  RepeatedField<long> *this;
  char *pcVar7;
  uint *puVar8;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar7 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  this = (RepeatedField<long> *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this & 7) == 0) {
    cVar1 = *ptr;
    while( true ) {
      pcVar7 = (char *)(long)*(char *)((long)ptr + 1);
      if ((long)pcVar7 < 0) {
        uVar4 = (long)(char)*(ushort *)((long)ptr + 2) << 7 | 0x7f;
        if ((long)uVar4 < 0) {
          aVar5.data = (long)*(char *)((long)ptr + 3) << 0xe | 0x3fff;
          if ((long)aVar5 < 0) {
            uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 4) << 0x15 | 0x1fffffU);
            if ((long)uVar4 < 0) {
              aVar5.data = aVar5.data & ((long)*(char *)((long)ptr + 5) << 0x1c | 0xfffffffU);
              if ((long)aVar5.data < 0) {
                uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 6) << 0x23 | 0x7ffffffffU);
                if ((long)uVar4 < 0) {
                  aVar5.data = aVar5.data &
                               ((long)*(char *)((long)ptr + 7) << 0x2a | 0x3ffffffffffU);
                  if ((long)aVar5 < 0) {
                    uVar4 = uVar4 & ((long)(char)*(ushort *)((long)ptr + 8) << 0x31 |
                                    0x1ffffffffffffU);
                    if ((long)uVar4 < 0) {
                      uVar6 = (ulong)*(byte *)((long)ptr + 9) << 0x38 | 0xffffffffffffff;
                      aVar5.data = aVar5.data & uVar6;
                      if ((long)aVar5 < 0) {
                        bVar2 = (byte)*(ushort *)((long)ptr + 10);
                        ptr = (char *)((long)ptr + 0xb);
                        if (bVar2 != 1) {
                          if ((char)bVar2 < '\0') {
                            pcVar7 = Error(msg,pcVar7,
                                           (ParseContext *)CONCAT71((int7)(uVar6 >> 8),bVar2),
                                           (TcFieldData)aVar5,table,hasbits);
                            return pcVar7;
                          }
                          if ((bVar2 & 1) == 0) {
                            aVar5.data = aVar5.data ^ 0x8000000000000000;
                          }
                        }
                      }
                      else {
                        ptr = (char *)((long)ptr + 10);
                      }
                    }
                    else {
                      ptr = (char *)((long)ptr + 9);
                    }
                  }
                  else {
                    ptr = (char *)((long)ptr + 8);
                  }
                }
                else {
                  ptr = (char *)((long)ptr + 7);
                }
              }
              else {
                ptr = (char *)((long)ptr + 6);
              }
            }
            else {
              ptr = (char *)((long)ptr + 5);
            }
          }
          else {
            ptr = (char *)((long)ptr + 4);
          }
          uVar4 = uVar4 & aVar5.data;
        }
        else {
          ptr = (char *)((long)ptr + 3);
        }
        pcVar7 = (char *)((ulong)pcVar7 & uVar4);
      }
      else {
        ptr = (char *)((long)ptr + 2);
      }
      RepeatedField<long>::Add(this,-(ulong)((uint)pcVar7 & 1) ^ (ulong)pcVar7 >> 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) break;
      if ((char)*(ushort *)ptr != cVar1) {
        uVar3 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
        if ((uVar3 & 7) == 0) {
          uVar4 = (ulong)(uVar3 & 0xfffffff8);
          pcVar7 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                                     (msg,ptr,ctx,
                                      (ulong)*(ushort *)ptr ^
                                      *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),table,hasbits)
          ;
          return pcVar7;
        }
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar8 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar8 & 3) != 0) {
        AlignFail(puVar8);
      }
      *puVar8 = *puVar8 | (uint)hasbits;
    }
    return (char *)(ushort *)ptr;
  }
  AlignFail(this);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastZ64R1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedVarint<int64_t, uint8_t, true>(
      PROTOBUF_TC_PARAM_PASS);
}